

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryRead
          (BlockedWrite *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Tag TVar1;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  *pOVar2;
  size_t in_R8;
  undefined1 local_c8 [16];
  Retry *_kj_switch_done_1;
  Retry *retry;
  Maybe<kj::AsyncCapabilityStream_&> local_a8;
  Done *_kj_switch_done;
  Done *done;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  local_88;
  undefined1 local_60 [8];
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
  _kj_switch_subject;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  BlockedWrite *this_local;
  
  tryReadImpl(&local_88,(BlockedWrite *)buffer,(void *)minBytes,maxBytes,in_R8);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  ::_switchSubject((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                    *)local_60,&local_88);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  ::~OneOf(&local_88);
  pOVar2 = kj::_::
           NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
           ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                         *)local_60);
  TVar1 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
          ::which(pOVar2);
  if (TVar1 == _variant0) {
    pOVar2 = kj::_::
             NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
             ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                           *)local_60);
    local_a8.ptr = (AsyncCapabilityStream *)
                   OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
                   ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done>(pOVar2);
    _kj_switch_done = (Done *)local_a8.ptr;
    if (local_a8.ptr == (AsyncCapabilityStream *)0x0) {
      retry._4_4_ = 2;
    }
    else {
      Promise<unsigned_long>::Promise
                ((Promise<unsigned_long> *)this,
                 (FixVoid<unsigned_long>)
                 ((local_a8.ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
                );
      retry._4_4_ = 1;
    }
  }
  else {
    if (TVar1 == _variant1) {
      pOVar2 = kj::_::
               NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
               ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                             *)local_60);
      local_c8._8_8_ =
           OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
           ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>(pOVar2);
      _kj_switch_done_1 = (Retry *)local_c8._8_8_;
      if ((Retry *)local_c8._8_8_ != (Retry *)0x0) {
        AsyncPipe::tryRead((AsyncPipe *)local_c8,*(void **)((long)buffer + 0x18),
                           (size_t)((Retry *)local_c8._8_8_)->buffer,
                           ((Retry *)local_c8._8_8_)->minBytes);
        Promise<unsigned_long>::
        then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>
                  ((Promise<unsigned_long> *)this,(Type *)local_c8);
        Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_c8);
        retry._4_4_ = 1;
        goto LAB_007be584;
      }
    }
    retry._4_4_ = 0;
  }
LAB_007be584:
  kj::_::
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
  ::~NullableValue((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                    *)local_60);
  if ((retry._4_4_ != 0) && (retry._4_4_ == 1)) {
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::unreachable();
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
      KJ_SWITCH_ONEOF(tryReadImpl(buffer, minBytes, maxBytes)) {
        KJ_CASE_ONEOF(done, Done) {
          return done.result;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          return pipe.tryRead(retry.buffer, retry.minBytes, retry.maxBytes)
              .then([n = retry.alreadyRead](size_t amount) { return amount + n; });
        }
      }
      KJ_UNREACHABLE;
    }